

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

size_t anon_unknown.dwarf_13ed181::collectPathsForDebug
                 (string *buffer,cmSearchPath *searchPath,size_t startIndex)

{
  pointer pPVar1;
  size_t sVar2;
  long *plVar3;
  long *plVar4;
  pointer pPVar5;
  long lVar6;
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pPVar5 = (searchPath->Paths).
           super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (searchPath->Paths).
           super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar5 == pPVar1) {
    std::__cxx11::string::append((char *)buffer);
    sVar2 = 0;
  }
  else {
    sVar2 = (long)pPVar1 - (long)pPVar5 >> 6;
    if (startIndex < sVar2) {
      lVar6 = startIndex << 6;
      do {
        std::operator+(&local_50,"  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(pPVar5->Path)._M_dataplus._M_p + lVar6));
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_60 = *plVar4;
          lStack_58 = plVar3[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar4;
          local_70 = (long *)*plVar3;
        }
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)buffer,(ulong)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        startIndex = startIndex + 1;
        pPVar5 = (searchPath->Paths).
                 super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar2 = (long)(searchPath->Paths).
                      super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 >> 6;
        lVar6 = lVar6 + 0x40;
      } while (startIndex < sVar2);
    }
  }
  return sVar2;
}

Assistant:

std::size_t collectPathsForDebug(std::string& buffer,
                                 cmSearchPath const& searchPath,
                                 std::size_t const startIndex = 0)
{
  const auto& paths = searchPath.GetPaths();
  if (paths.empty()) {
    buffer += "  none\n";
    return 0;
  }
  for (auto i = startIndex; i < paths.size(); i++) {
    buffer += "  " + paths[i].Path + "\n";
  }
  return paths.size();
}